

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::MemberSyntax> *args_9;
  ClassDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor_4;
  ImplementsClauseSyntax *local_90;
  ExtendsClauseSyntax *local_88;
  ParameterPortListSyntax *local_80;
  DeepCloneVisitor visitor;
  ClassSpecifierSyntax *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x70) == (SyntaxNode *)0x0) {
    local_68 = (ClassSpecifierSyntax *)0x0;
  }
  else {
    local_68 = (ClassSpecifierSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x70),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x88) == (SyntaxNode *)0x0) {
    local_80 = (ParameterPortListSyntax *)0x0;
  }
  else {
    local_80 = (ParameterPortListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x88),&visitor_1,(BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x90) == (SyntaxNode *)0x0) {
    local_88 = (ExtendsClauseSyntax *)0x0;
  }
  else {
    local_88 = (ExtendsClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x90),&visitor_1,(BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x98) == (SyntaxNode *)0x0) {
    local_90 = (ImplementsClauseSyntax *)0x0;
  }
  else {
    local_90 = (ImplementsClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x98),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  args_9 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0xb0),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xe8),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xf8) == (SyntaxNode *)0x0) {
    _visitor_4 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_4 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xf8),&visitor_4,(BumpAllocator *)__child_stack)
    ;
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClassDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ClassSpecifierSyntax*,slang::parsing::Token,slang::syntax::ParameterPortListSyntax*,slang::syntax::ExtendsClauseSyntax*,slang::syntax::ImplementsClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_40,&local_50,&local_68,
                      (Token *)&visitor,&local_80,&local_88,&local_90,(Token *)&visitor_1,args_9,
                      &local_60,(NamedBlockClauseSyntax **)&visitor_4);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClassDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClassDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.virtualOrInterface.deepClone(alloc),
        node.classKeyword.deepClone(alloc),
        node.finalSpecifier ? deepClone(*node.finalSpecifier, alloc) : nullptr,
        node.name.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.extendsClause ? deepClone(*node.extendsClause, alloc) : nullptr,
        node.implementsClause ? deepClone(*node.implementsClause, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endClass.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}